

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

bam_hdr_t * bam_hdr_dup(bam_hdr_t *h0)

{
  uint uVar1;
  ulong uVar2;
  bam_hdr_t *pbVar3;
  char *pcVar4;
  uint32_t *puVar5;
  char **ppcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (h0 != (bam_hdr_t *)0x0) {
    pbVar3 = bam_hdr_init();
    uVar7 = 0;
    if (pbVar3 != (bam_hdr_t *)0x0) {
      uVar2._0_4_ = h0->n_targets;
      uVar2._4_4_ = h0->ignore_sam_err;
      pbVar3->n_targets = (undefined4)uVar2;
      pbVar3->ignore_sam_err = uVar2._4_4_;
      uVar1 = h0->l_text;
      pbVar3->l_text = uVar1;
      pbVar3->cigar_tab = (int8_t *)0x0;
      pbVar3->sdict = (void *)0x0;
      pcVar4 = (char *)calloc((ulong)(uVar1 + 1),1);
      pbVar3->text = pcVar4;
      memcpy(pcVar4,h0->text,(ulong)uVar1);
      puVar5 = (uint32_t *)calloc((long)(int)(undefined4)uVar2,4);
      pbVar3->target_len = puVar5;
      ppcVar6 = (char **)calloc((long)(int)(undefined4)uVar2,8);
      pbVar3->target_name = ppcVar6;
      uVar8 = uVar2 & 0xffffffff;
      if ((int)(undefined4)uVar2 < 1) {
        uVar8 = uVar7;
      }
      for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        puVar5[uVar7] = h0->target_len[uVar7];
        pcVar4 = strdup(h0->target_name[uVar7]);
        ppcVar6[uVar7] = pcVar4;
      }
      return pbVar3;
    }
  }
  return (bam_hdr_t *)0x0;
}

Assistant:

bam_hdr_t *bam_hdr_dup(const bam_hdr_t *h0)
{
    if (h0 == NULL) return NULL;
    bam_hdr_t *h;
    if ((h = bam_hdr_init()) == NULL) return NULL;
    // copy the simple data
    h->n_targets = h0->n_targets;
    h->ignore_sam_err = h0->ignore_sam_err;
    h->l_text = h0->l_text;
    // Then the pointery stuff
    h->cigar_tab = NULL;
    h->sdict = NULL;
    h->text = (char*)calloc(h->l_text + 1, 1);
    memcpy(h->text, h0->text, h->l_text);
    h->target_len = (uint32_t*)calloc(h->n_targets, sizeof(uint32_t));
    h->target_name = (char**)calloc(h->n_targets, sizeof(char*));
    int i;
    for (i = 0; i < h->n_targets; ++i) {
        h->target_len[i] = h0->target_len[i];
        h->target_name[i] = strdup(h0->target_name[i]);
    }
    return h;
}